

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O0

char queryparse::transform_char(node *n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  runtime_error *this;
  long in_RDI;
  string *content;
  undefined4 in_stack_ffffffffffffffb0;
  char cVar5;
  undefined4 in_stack_ffffffffffffffb4;
  string local_38 [16];
  default_node_content *in_stack_ffffffffffffffd8;
  char local_1;
  
  cVar5 = (char)((uint)in_stack_ffffffffffffffb4 >> 0x10);
  tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_(in_stack_ffffffffffffffd8);
  bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::hexbyte>
                    ((default_node_content *)(in_RDI + 0x18));
  if (bVar1) {
    std::__cxx11::string::operator[]((ulong)local_38);
    cVar5 = (char)((uint)in_stack_ffffffffffffffb0 >> 0x18);
    iVar2 = hex2int(cVar5);
    std::__cxx11::string::operator[]((ulong)local_38);
    iVar3 = hex2int(cVar5);
    local_1 = (char)(iVar2 << 4) + (char)iVar3;
  }
  else {
    bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::ascii_char>
                      ((default_node_content *)(in_RDI + 0x18));
    if (bVar1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      local_1 = *pcVar4;
    }
    else {
      bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::escaped_char>
                        ((default_node_content *)(in_RDI + 0x18));
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"unknown character parse");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator[]((ulong)local_38);
      local_1 = unescape_char(cVar5);
    }
  }
  std::__cxx11::string::~string(local_38);
  return local_1;
}

Assistant:

char transform_char(const parse_tree::node &n) {
    const std::string &content = n.content();
    if (n.is<hexbyte>()) {
        return static_cast<char>((hex2int(content[0]) << 4) +
                                 hex2int(content[1]));
    }
    if (n.is<ascii_char>()) {
        return content[0];
    }
    if (n.is<escaped_char>()) {
        return unescape_char(content[0]);
    }
    throw std::runtime_error("unknown character parse");
}